

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::GenericDescriptor::Dump(GenericDescriptor *this,FILE *stream)

{
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,stream);
  fprintf((FILE *)stream,"  %22s:\n","Locators");
  FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::Dump
            (&(this->Locators).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>,
             stream,0);
  fprintf((FILE *)stream,"  %22s:\n","SubDescriptors");
  FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::Dump
            (&(this->SubDescriptors).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>,
             stream,0);
  return;
}

Assistant:

void
GenericDescriptor::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s:\n",  "Locators");
  Locators.Dump(stream);
  fprintf(stream, "  %22s:\n",  "SubDescriptors");
  SubDescriptors.Dump(stream);
}